

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# serialize.h
# Opt level: O0

void Unserialize<ParamsStream<SpanReader&,TransactionSerParams>,28u,unsigned_char>
               (ParamsStream<SpanReader_&,_TransactionSerParams> *is,
               prevector<28U,_unsigned_char,_unsigned_int,_int> *v)

{
  long lVar1;
  Span<unsigned_char> s;
  uint new_size;
  uint64_t uVar2;
  uint *puVar3;
  size_t in_RCX;
  prevector<28U,_unsigned_char,_unsigned_int,_int> *in_RSI;
  prevector<28U,_unsigned_char,_unsigned_int,_int> *in_RDI;
  long in_FS_OFFSET;
  uint blk;
  uint i;
  uint nSize;
  ParamsStream<SpanReader_&,_TransactionSerParams> *in_stack_00000038;
  prevector<28U,_unsigned_char,_unsigned_int,_int> *in_stack_ffffffffffffffa8;
  Span<std::byte> in_stack_ffffffffffffffb0;
  undefined4 in_stack_ffffffffffffffc0;
  uint uVar4;
  uint uVar5;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  prevector<28U,_unsigned_char,_unsigned_int,_int>::clear(in_stack_ffffffffffffffa8);
  uVar2 = ReadCompactSize<ParamsStream<SpanReader&,TransactionSerParams>>
                    (in_stack_00000038,is._7_1_);
  new_size = (uint)uVar2;
  for (uVar5 = 0; uVar5 < new_size; uVar5 = uVar4 + uVar5) {
    puVar3 = std::min<unsigned_int>
                       ((uint *)in_stack_ffffffffffffffb0.m_data,(uint *)in_stack_ffffffffffffffa8);
    uVar4 = *puVar3;
    prevector<28U,_unsigned_char,_unsigned_int,_int>::resize_uninitialized(in_RSI,new_size);
    in_stack_ffffffffffffffa8 = in_RDI;
    prevector<28U,_unsigned_char,_unsigned_int,_int>::operator[]
              ((prevector<28U,_unsigned_char,_unsigned_int,_int> *)in_stack_ffffffffffffffb0.m_size,
               in_stack_ffffffffffffffb0.m_data._4_4_);
    Span<unsigned_char>::Span<unsigned_char,_0>
              ((Span<unsigned_char> *)in_stack_ffffffffffffffb0.m_size,
               in_stack_ffffffffffffffb0.m_data,(size_t)in_stack_ffffffffffffffa8);
    s.m_data._4_4_ = uVar4;
    s.m_data._0_4_ = in_stack_ffffffffffffffc0;
    s.m_size._0_4_ = uVar5;
    s.m_size._4_4_ = new_size;
    in_stack_ffffffffffffffb0 = AsWritableBytes<unsigned_char>(s);
    ParamsStream<SpanReader_&,_TransactionSerParams>::read
              ((ParamsStream<SpanReader_&,_TransactionSerParams> *)in_stack_ffffffffffffffa8,
               (int)in_stack_ffffffffffffffb0.m_data,(void *)in_stack_ffffffffffffffb0.m_size,in_RCX
              );
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void Unserialize(Stream& is, prevector<N, T>& v)
{
    if constexpr (BasicByte<T>) { // Use optimized version for unformatted basic bytes
        // Limit size per read so bogus size value won't cause out of memory
        v.clear();
        unsigned int nSize = ReadCompactSize(is);
        unsigned int i = 0;
        while (i < nSize) {
            unsigned int blk = std::min(nSize - i, (unsigned int)(1 + 4999999 / sizeof(T)));
            v.resize_uninitialized(i + blk);
            is.read(AsWritableBytes(Span{&v[i], blk}));
            i += blk;
        }
    } else {
        Unserialize(is, Using<VectorFormatter<DefaultFormatter>>(v));
    }
}